

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTests.cpp
# Opt level: O0

void (anonymous_namespace)::
     test_cartesian_product<std::__cxx11::string(&)(std::__cxx11::string_const&,std::__cxx11::string_const&),std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (Results *expected,
               _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *converter,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *input0,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *inputs)

{
  code *pcVar1;
  double dVar2;
  byte extraout_AL;
  Enum EVar3;
  undefined8 in_RSI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Expression_lhs<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  EVar4;
  ResultBuilder DOCTEST_RB;
  AccumulateResults<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  results_store;
  Result *res;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  char *in_stack_fffffffffffffea8;
  anon_union_24_2_13149d16_for_String_3 *this;
  ExpressionDecomposer local_134;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_130;
  Enum local_128;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  Enum in_stack_ffffffffffffff2c;
  ResultBuilder *in_stack_ffffffffffffff30;
  String *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  AccumulateResults<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff80;
  anon_union_24_2_13149d16_for_String_3 local_48;
  undefined8 local_30;
  undefined8 local_10;
  
  local_48.data.ptr = (char *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  this = &local_48;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1e8740);
  local_30 = local_10;
  ApprovalTests::CartesianProduct::
  cartesian_product<(anonymous_namespace)::AccumulateResults<std::__cxx11::string(&)(std::__cxx11::string_const&,std::__cxx11::string_const&)>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff70);
  doctest::String::String((String *)&this->data,in_stack_fffffffffffffea8);
  res = (Result *)&stack0xffffffffffffff00;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,(char *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff1c,(char *)in_stack_ffffffffffffff10,
             (char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff40);
  doctest::String::~String((String *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_134,DT_REQUIRE);
  EVar4 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)res);
  local_130 = EVar4.lhs;
  EVar3 = EVar4.m_at;
  local_128 = EVar3;
  doctest::detail::
  Expression_lhs<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>::
  operator==((Expression_lhs<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
              *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff20);
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(EVar3,in_stack_fffffffffffffea0),res);
  doctest::detail::Result::~Result((Result *)0x1e884d);
  dVar2 = doctest::detail::ResultBuilder::log
                    ((ResultBuilder *)&stack0xffffffffffffff18,
                     (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)
               CONCAT44(EVar3,CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffea0)));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1e8956);
    anon_unknown.dwarf_227842::
    AccumulateResults<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~AccumulateResults
              ((AccumulateResults<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)0x1e8965);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)(SUB84(dVar2,0));
  return;
}

Assistant:

void test_cartesian_product(const Results& expected,
                                Converter&& converter,
                                const Container& input0,
                                const Containers&... inputs)
    {
        auto results_store =
            AccumulateResults<Converter>{Results(), std::forward<Converter>(converter)};
        CartesianProduct::cartesian_product(results_store, input0, inputs...);
        REQUIRE(results_store.results == expected);
    }